

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TerragenLoader.cpp
# Opt level: O1

void __thiscall
Assimp::TerragenImporter::InternReadFile
          (TerragenImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  int8_t **ppiVar1;
  int8_t *piVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  undefined4 extraout_var;
  aiNode *this_00;
  aiMesh **ppaVar12;
  aiMesh *paVar13;
  ulong *puVar14;
  aiVector3D *__s;
  aiVector3D *__s_00;
  Logger *this_01;
  uint *puVar15;
  long *plVar16;
  runtime_error *prVar17;
  aiFace *paVar18;
  long lVar19;
  long *plVar20;
  uint uVar21;
  aiFace *paVar22;
  ulong uVar23;
  ulong uVar24;
  float fVar25;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  StreamReaderLE reader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  float local_100;
  uint local_fc;
  int local_f8;
  float local_f4;
  aiVector3D **local_f0;
  long local_e8;
  float local_dc;
  float local_d8;
  float local_d4;
  StreamReader<false,_false> local_d0;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  TerragenImporter *local_88;
  aiScene *local_80;
  aiNode *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  ppiVar1 = &local_d0.buffer;
  local_d0.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)ppiVar1;
  local_88 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"rb","");
  iVar7 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,
                     local_d0.stream.
                     super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (local_d0.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)ppiVar1) {
    operator_delete(local_d0.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
  }
  if ((IOStream *)CONCAT44(extraout_var,iVar7) == (IOStream *)0x0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_120,"Failed to open TERRAGEN TERRAIN file ",pFile);
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_d0.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar16;
    plVar20 = plVar16 + 2;
    if (local_d0.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)plVar20) {
      local_d0.buffer = (int8_t *)*plVar20;
      local_d0.current = (int8_t *)plVar16[3];
      local_d0.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)ppiVar1;
    }
    else {
      local_d0.buffer = (int8_t *)*plVar20;
    }
    local_d0.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar16[1];
    *plVar16 = (long)plVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::runtime_error::runtime_error(prVar17,(string *)&local_d0);
    *(undefined ***)prVar17 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  StreamReader<false,_false>::StreamReader(&local_d0,(IOStream *)CONCAT44(extraout_var,iVar7),false)
  ;
  piVar2 = local_d0.current;
  if (((int)local_d0.end - (int)local_d0.current & 0xfffffff0U) == 0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"TER: file is too small","");
    std::runtime_error::runtime_error(prVar17,(string *)&local_120);
    *(undefined ***)prVar17 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar7 = strncmp(local_d0.current,"TERRAGEN",8);
  if (iVar7 != 0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"TER: Magic string \'TERRAGEN\' not found","");
    std::runtime_error::runtime_error(prVar17,(string *)&local_120);
    *(undefined ***)prVar17 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar7 = strncmp(piVar2 + 8,"TERRAIN ",8);
  if (iVar7 != 0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"TER: Magic string \'TERRAIN\' not found","");
    std::runtime_error::runtime_error(prVar17,(string *)&local_120);
    *(undefined ***)prVar17 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pScene->mRootNode = this_00;
  (this_00->mName).length = 0x12;
  builtin_strncpy((this_00->mName).data,"<TERRAGEN.TERRAIN>",0x13);
  (this_00->mTransformation).c3 = 30.0;
  (this_00->mTransformation).b2 = 30.0;
  (this_00->mTransformation).a1 = 30.0;
  StreamReader<false,_false>::IncPtr(&local_d0,0x10);
  uVar10 = 0;
  uVar9 = 0;
  do {
    piVar2 = local_d0.current;
    if (((int)local_d0.end - (int)local_d0.current & 0xfffffffcU) == 0) break;
    StreamReader<false,_false>::IncPtr(&local_d0,4);
    iVar7 = strncmp(piVar2,"EOF ",4);
    if (iVar7 != 0) {
      local_f8 = iVar7;
      iVar7 = strncmp(piVar2,"XPTS",4);
      if (iVar7 == 0) {
        uVar6 = StreamReader<false,_false>::Get<short>(&local_d0);
        uVar9 = (uint)uVar6;
      }
      else {
        iVar7 = strncmp(piVar2,"YPTS",4);
        if (iVar7 == 0) {
          uVar6 = StreamReader<false,_false>::Get<short>(&local_d0);
          uVar10 = (uint)uVar6;
        }
        else {
          iVar7 = strncmp(piVar2,"SIZE",4);
          if (iVar7 == 0) {
            uVar6 = StreamReader<false,_false>::Get<short>(&local_d0);
            uVar10 = uVar6 + 1;
            uVar9 = uVar10;
          }
          else {
            iVar7 = strncmp(piVar2,"SCAL",4);
            if (iVar7 == 0) {
              fVar25 = StreamReader<false,_false>::Get<float>(&local_d0);
              (this_00->mTransformation).a1 = fVar25;
              fVar25 = StreamReader<false,_false>::Get<float>(&local_d0);
              (this_00->mTransformation).b2 = fVar25;
              fVar25 = StreamReader<false,_false>::Get<float>(&local_d0);
              (this_00->mTransformation).c3 = fVar25;
            }
            else {
              iVar7 = strncmp(piVar2,"CRAD",4);
              if (iVar7 == 0) {
                StreamReader<false,_false>::Get<float>(&local_d0);
              }
              else {
                iVar7 = strncmp(piVar2,"CRVM",4);
                if (iVar7 == 0) {
                  cVar3 = StreamReader<false,_false>::Get<signed_char>(&local_d0);
                  if (cVar3 != '\0') {
                    this_01 = DefaultLogger::get();
                    Logger::error(this_01,
                                  "TER: Unsupported mapping mode, a flat terrain is returned");
                  }
                }
                else {
                  iVar7 = strncmp(piVar2,"ALTW",4);
                  if (iVar7 == 0) {
                    sVar4 = StreamReader<false,_false>::Get<short>(&local_d0);
                    sVar5 = StreamReader<false,_false>::Get<short>(&local_d0);
                    piVar2 = local_d0.current;
                    if ((uint)((int)local_d0.end - (int)local_d0.current) < uVar10 * uVar9 * 2) {
                      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
                      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_120,"TER: ALTW chunk is too small","");
                      std::runtime_error::runtime_error(prVar17,(string *)&local_120);
                      *(undefined ***)prVar17 = &PTR__runtime_error_00900168;
                      __cxa_throw(prVar17,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_98._0_4_ = (float)(int)sVar4 * 1.5258789e-05;
                    if ((uVar9 < 2) || (uVar10 < 2)) {
                      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
                      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_120,"TER: Invalid terrain size","");
                      std::runtime_error::runtime_error(prVar17,(string *)&local_120);
                      *(undefined ***)prVar17 = &PTR__runtime_error_00900168;
                      __cxa_throw(prVar17,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    pScene->mNumMeshes = 1;
                    uStack_90 = extraout_XMM0_Dc;
                    uStack_8c = extraout_XMM0_Dd;
                    local_98._4_4_ = extraout_XMM0_Db;
                    ppaVar12 = (aiMesh **)operator_new__(8);
                    local_e8 = CONCAT62(local_e8._2_6_,sVar5);
                    pScene->mMeshes = ppaVar12;
                    local_80 = pScene;
                    local_78 = this_00;
                    paVar13 = (aiMesh *)operator_new(0x520);
                    paVar13->mPrimitiveTypes = 0;
                    paVar13->mNumVertices = 0;
                    paVar13->mNumFaces = 0;
                    local_f0 = &paVar13->mVertices;
                    memset(local_f0,0,0xcc);
                    paVar13->mBones = (aiBone **)0x0;
                    paVar13->mMaterialIndex = 0;
                    (paVar13->mName).length = 0;
                    (paVar13->mName).data[0] = '\0';
                    memset((paVar13->mName).data + 1,0x1b,0x3ff);
                    paVar13->mNumAnimMeshes = 0;
                    paVar13->mAnimMeshes = (aiAnimMesh **)0x0;
                    paVar13->mMethod = 0;
                    (paVar13->mAABB).mMin.x = 0.0;
                    (paVar13->mAABB).mMin.y = 0.0;
                    (paVar13->mAABB).mMin.z = 0.0;
                    (paVar13->mAABB).mMax.x = 0.0;
                    (paVar13->mAABB).mMax.y = 0.0;
                    (paVar13->mAABB).mMax.z = 0.0;
                    paVar13->mTextureCoords[0] = (aiVector3D *)0x0;
                    paVar13->mTextureCoords[1] = (aiVector3D *)0x0;
                    paVar13->mTextureCoords[2] = (aiVector3D *)0x0;
                    paVar13->mTextureCoords[3] = (aiVector3D *)0x0;
                    paVar13->mTextureCoords[4] = (aiVector3D *)0x0;
                    paVar13->mTextureCoords[5] = (aiVector3D *)0x0;
                    paVar13->mTextureCoords[6] = (aiVector3D *)0x0;
                    paVar13->mTextureCoords[7] = (aiVector3D *)0x0;
                    paVar13->mNumUVComponents[0] = 0;
                    paVar13->mNumUVComponents[1] = 0;
                    paVar13->mNumUVComponents[2] = 0;
                    paVar13->mNumUVComponents[3] = 0;
                    paVar13->mNumUVComponents[4] = 0;
                    paVar13->mNumUVComponents[5] = 0;
                    paVar13->mNumUVComponents[6] = 0;
                    paVar13->mNumUVComponents[7] = 0;
                    paVar13->mColors[0] = (aiColor4D *)0x0;
                    paVar13->mColors[1] = (aiColor4D *)0x0;
                    paVar13->mColors[2] = (aiColor4D *)0x0;
                    paVar13->mColors[3] = (aiColor4D *)0x0;
                    paVar13->mColors[4] = (aiColor4D *)0x0;
                    paVar13->mColors[5] = (aiColor4D *)0x0;
                    paVar13->mColors[6] = (aiColor4D *)0x0;
                    paVar13->mColors[7] = (aiColor4D *)0x0;
                    *ppaVar12 = paVar13;
                    local_fc = uVar9 - 1;
                    uVar21 = uVar10 - 1;
                    uVar8 = local_fc * uVar21;
                    paVar13->mNumFaces = uVar8;
                    uVar23 = (ulong)uVar8;
                    puVar14 = (ulong *)operator_new__(uVar23 * 0x10 + 8);
                    local_d4 = (float)(int)(short)local_e8;
                    local_48 = (float)(~-(uint)((float)local_98 != 0.0) & 0x3f800000 |
                                      (uint)(float)local_98 & -(uint)((float)local_98 != 0.0));
                    uStack_44 = local_98._4_4_;
                    uStack_40 = uStack_90;
                    uStack_3c = uStack_8c;
                    local_98 = paVar13->mTextureCoords;
                    *puVar14 = uVar23;
                    paVar22 = (aiFace *)(puVar14 + 1);
                    paVar18 = paVar22;
                    do {
                      paVar18->mNumIndices = 0;
                      paVar18->mIndices = (uint *)0x0;
                      paVar18 = paVar18 + 1;
                    } while (paVar18 != (aiFace *)(puVar14 + uVar23 * 2 + 1));
                    paVar13->mFaces = paVar22;
                    uVar23 = (ulong)(uVar8 * 4);
                    paVar13->mNumVertices = uVar8 * 4;
                    __s = (aiVector3D *)operator_new__(uVar23 * 0xc);
                    if (uVar23 != 0) {
                      memset(__s,0,((uVar23 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
                    }
                    *local_f0 = __s;
                    if (local_88->configComputeUVs == true) {
                      __s_00 = (aiVector3D *)operator_new__(uVar23 * 0xc);
                      if ((uVar8 & 0x3fffffff) != 0) {
                        memset(__s_00,0,((uVar23 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
                      }
                      *local_98 = __s_00;
                      local_100 = 1.0 / (float)uVar10;
                      local_f4 = 1.0 / (float)uVar9;
                    }
                    else {
                      local_100 = 0.0;
                      __s_00 = (aiVector3D *)0x0;
                      local_f4 = 0.0;
                    }
                    if (uVar21 != 0) {
                      local_70 = (ulong)uVar9;
                      local_68 = (ulong)uVar21;
                      local_58 = (ulong)local_fc;
                      uVar23 = 0;
                      iVar7 = 0;
                      do {
                        if (local_fc != 0) {
                          local_dc = (float)(int)uVar23;
                          local_e8 = uVar23 * local_70;
                          local_f0 = (aiVector3D **)CONCAT44(local_f0._4_4_,local_dc + 1.0);
                          local_50 = (uVar23 + 1) * local_70;
                          local_98 = (aiVector3D **)CONCAT44(local_98._4_4_,local_dc);
                          local_dc = local_100 * local_dc;
                          local_d8 = (float)(int)(uVar23 + 1) * local_100;
                          uVar24 = 0;
                          local_60 = uVar23;
                          do {
                            iVar11 = iVar7;
                            fVar25 = (float)(int)uVar24;
                            sVar4 = *(short *)(piVar2 + (local_e8 + uVar24) * 2);
                            __s->x = fVar25;
                            __s->y = (float)local_98;
                            __s->z = (float)(int)sVar4 * local_48 + local_d4;
                            sVar4 = *(short *)(piVar2 + (uVar24 + local_50) * 2);
                            __s[1].x = fVar25;
                            __s[1].y = local_f0._0_4_;
                            __s[1].z = (float)(int)sVar4 * local_48 + local_d4;
                            sVar4 = *(short *)(piVar2 + (uVar24 + local_50) * 2 + 2);
                            __s[2].x = fVar25 + 1.0;
                            __s[2].y = local_f0._0_4_;
                            __s[2].z = (float)(int)sVar4 * local_48 + local_d4;
                            sVar4 = *(short *)(piVar2 + (local_e8 + uVar24) * 2 + 2);
                            __s[3].x = fVar25 + 1.0;
                            __s[3].y = (float)local_98;
                            __s[3].z = (float)(int)sVar4 * local_48 + local_d4;
                            if (local_88->configComputeUVs == true) {
                              __s_00->x = fVar25 * local_f4;
                              __s_00->y = local_dc;
                              __s_00->z = 0.0;
                              __s_00[1].x = fVar25 * local_f4;
                              __s_00[1].y = local_d8;
                              __s_00[1].z = 0.0;
                              fVar25 = (float)((int)uVar24 + 1) * local_f4;
                              __s_00[2].x = fVar25;
                              __s_00[2].y = local_d8;
                              __s_00[2].z = 0.0;
                              __s_00[3].x = fVar25;
                              __s_00[3].y = local_dc;
                              __s_00[3].z = 0.0;
                              __s_00 = __s_00 + 4;
                            }
                            paVar22->mNumIndices = 4;
                            puVar15 = (uint *)operator_new__(0x10);
                            __s = __s + 4;
                            paVar22->mIndices = puVar15;
                            lVar19 = 0;
                            do {
                              paVar22->mIndices[lVar19] = iVar11 + (int)lVar19;
                              lVar19 = lVar19 + 1;
                            } while (lVar19 != 4);
                            uVar24 = uVar24 + 1;
                            paVar22 = paVar22 + 1;
                            iVar7 = iVar11 + 4;
                          } while (uVar24 != local_58);
                          iVar7 = iVar11 + 4;
                          uVar23 = local_60;
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar23 != local_68);
                    }
                    this_00 = local_78;
                    local_78->mNumMeshes = 1;
                    puVar15 = (uint *)operator_new__(4);
                    this_00->mMeshes = puVar15;
                    *puVar15 = 0;
                    pScene = local_80;
                  }
                }
              }
            }
          }
        }
      }
      uVar8 = (int)local_d0.current - (int)local_d0.buffer & 3;
      iVar7 = local_f8;
      if (uVar8 != 0) {
        StreamReader<false,_false>::IncPtr(&local_d0,(ulong)(4 - uVar8));
        iVar7 = local_f8;
      }
    }
  } while (iVar7 != 0);
  if (pScene->mNumMeshes != 1) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"TER: Unable to load terrain","");
    std::runtime_error::runtime_error(prVar17,(string *)&local_120);
    *(undefined ***)prVar17 = &PTR__runtime_error_00900168;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 0x10;
  StreamReader<false,_false>::~StreamReader(&local_d0);
  return;
}

Assistant:

void TerragenImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    IOStream* file = pIOHandler->Open( pFile, "rb");

    // Check whether we can read from the file
    if( file == NULL)
        throw DeadlyImportError( "Failed to open TERRAGEN TERRAIN file " + pFile + ".");

    // Construct a stream reader to read all data in the correct endianness
    StreamReaderLE reader(file);
    if(reader.GetRemainingSize() < 16)
        throw DeadlyImportError( "TER: file is too small" );

    // Check for the existence of the two magic strings 'TERRAGEN' and 'TERRAIN '
    if (::strncmp((const char*)reader.GetPtr(),AI_TERR_BASE_STRING,8))
        throw DeadlyImportError( "TER: Magic string \'TERRAGEN\' not found" );

    if (::strncmp((const char*)reader.GetPtr()+8,AI_TERR_TERRAIN_STRING,8))
        throw DeadlyImportError( "TER: Magic string \'TERRAIN\' not found" );

    unsigned int x = 0,y = 0,mode = 0;

    aiNode* root = pScene->mRootNode = new aiNode();
    root->mName.Set("<TERRAGEN.TERRAIN>");

    // Default scaling is 30
    root->mTransformation.a1 = root->mTransformation.b2 = root->mTransformation.c3 = 30.f;

    // Now read all chunks until we're finished or an EOF marker is encountered
    reader.IncPtr(16);
    while (reader.GetRemainingSize() >= 4)
    {
        const char* head = (const char*)reader.GetPtr();
        reader.IncPtr(4);

        // EOF, break in every case
        if (!::strncmp(head,AI_TERR_EOF_STRING,4))
            break;

        // Number of x-data points
        if (!::strncmp(head,AI_TERR_CHUNK_XPTS,4))
        {
            x = (uint16_t)reader.GetI2();
        }
        // Number of y-data points
        else if (!::strncmp(head,AI_TERR_CHUNK_YPTS,4))
        {
            y = (uint16_t)reader.GetI2();
        }
        // Squared terrains width-1.
        else if (!::strncmp(head,AI_TERR_CHUNK_SIZE,4))
        {
            x = y = (uint16_t)reader.GetI2()+1;
        }
        // terrain scaling
        else if (!::strncmp(head,AI_TERR_CHUNK_SCAL,4))
        {
            root->mTransformation.a1 = reader.GetF4();
            root->mTransformation.b2 = reader.GetF4();
            root->mTransformation.c3 = reader.GetF4();
        }
        // mapping == 1: earth radius
        else if (!::strncmp(head,AI_TERR_CHUNK_CRAD,4))
        {
            reader.GetF4();
        }
        // mapping mode
        else if (!::strncmp(head,AI_TERR_CHUNK_CRVM,4))
        {
            mode = reader.GetI1();
            if (0 != mode)
                ASSIMP_LOG_ERROR("TER: Unsupported mapping mode, a flat terrain is returned");
        }
        // actual terrain data
        else if (!::strncmp(head,AI_TERR_CHUNK_ALTW,4))
        {
            float hscale  = (float)reader.GetI2()  / 65536;
            float bheight = (float)reader.GetI2();

            if (!hscale)hscale = 1;

            // Ensure we have enough data
            if (reader.GetRemainingSize() < x*y*2)
                throw DeadlyImportError("TER: ALTW chunk is too small");

            if (x <= 1 || y <= 1)
                throw DeadlyImportError("TER: Invalid terrain size");

            // Allocate the output mesh
            pScene->mMeshes = new aiMesh*[pScene->mNumMeshes = 1];
            aiMesh* m = pScene->mMeshes[0] = new aiMesh();

            // We return quads
            aiFace* f = m->mFaces = new aiFace[m->mNumFaces = (x-1)*(y-1)];
            aiVector3D* pv = m->mVertices = new aiVector3D[m->mNumVertices = m->mNumFaces*4];

            aiVector3D *uv( NULL );
            float step_y( 0.0f ), step_x( 0.0f );
            if (configComputeUVs) {
                uv = m->mTextureCoords[0] = new aiVector3D[m->mNumVertices];
                step_y = 1.f/y;
                step_x = 1.f/x;
            }
            const int16_t* data = (const int16_t*)reader.GetPtr();

            for (unsigned int yy = 0, t = 0; yy < y-1;++yy) {
                for (unsigned int xx = 0; xx < x-1;++xx,++f)    {

                    // make verts
                    const float fy = (float)yy, fx = (float)xx;
                    unsigned tmp,tmp2;
                    *pv++ = aiVector3D(fx,fy,    (float)data[(tmp2=x*yy)    + xx] * hscale + bheight);
                    *pv++ = aiVector3D(fx,fy+1,  (float)data[(tmp=x*(yy+1)) + xx] * hscale + bheight);
                    *pv++ = aiVector3D(fx+1,fy+1,(float)data[tmp  + xx+1]         * hscale + bheight);
                    *pv++ = aiVector3D(fx+1,fy,  (float)data[tmp2 + xx+1]         * hscale + bheight);

                    // also make texture coordinates, if necessary
                    if (configComputeUVs) {
                        *uv++ = aiVector3D( step_x*xx,     step_y*yy,     0.f );
                        *uv++ = aiVector3D( step_x*xx,     step_y*(yy+1), 0.f );
                        *uv++ = aiVector3D( step_x*(xx+1), step_y*(yy+1), 0.f );
                        *uv++ = aiVector3D( step_x*(xx+1), step_y*yy,     0.f );
                    }

                    // make indices
                    f->mIndices = new unsigned int[f->mNumIndices = 4];
                    for (unsigned int i = 0; i < 4;++i)
                        f->mIndices[i] = t++;
                }
            }

            // Add the mesh to the root node
            root->mMeshes = new unsigned int[root->mNumMeshes = 1];
            root->mMeshes[0] = 0;
        }

        // Get to the next chunk (4 byte aligned)
        unsigned dtt;
        if ((dtt = reader.GetCurrentPos() & 0x3))
            reader.IncPtr(4-dtt);
    }

    // Check whether we have a mesh now
    if (pScene->mNumMeshes != 1)
        throw DeadlyImportError("TER: Unable to load terrain");

    // Set the AI_SCENE_FLAGS_TERRAIN bit
    pScene->mFlags |= AI_SCENE_FLAGS_TERRAIN;
}